

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

int lua_getstack(lua_State *L,int level,lua_Debug *ar)

{
  CallInfo *local_38;
  CallInfo *ci;
  int status;
  lua_Debug *ar_local;
  int level_local;
  lua_State *L_local;
  
  if (level < 0) {
    L_local._4_4_ = 0;
  }
  else {
    local_38 = L->ci;
    for (ar_local._4_4_ = level; 0 < ar_local._4_4_ && local_38 != &L->base_ci;
        ar_local._4_4_ = ar_local._4_4_ + -1) {
      local_38 = local_38->previous;
    }
    if ((ar_local._4_4_ == 0) && (local_38 != &L->base_ci)) {
      ci._4_4_ = 1;
      ar->i_ci = local_38;
    }
    else {
      ci._4_4_ = 0;
    }
    L_local._4_4_ = ci._4_4_;
  }
  return L_local._4_4_;
}

Assistant:

LUA_API int lua_getstack (lua_State *L, int level, lua_Debug *ar) {
  int status;
  CallInfo *ci;
  if (level < 0) return 0;  /* invalid (negative) level */
  lua_lock(L);
  for (ci = L->ci; level > 0 && ci != &L->base_ci; ci = ci->previous)
    level--;
  if (level == 0 && ci != &L->base_ci) {  /* level found? */
    status = 1;
    ar->i_ci = ci;
  }
  else status = 0;  /* no such level */
  lua_unlock(L);
  return status;
}